

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O1

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  ushort uVar1;
  __node_base_ptr p_Var2;
  int iVar3;
  _Hash_node_base *p_Var4;
  Value *pVVar5;
  Value *extraout_RAX;
  socklen_t *__addr_len_00;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  undefined4 in_register_00000034;
  IRGenerator *__addr_00;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  long *plVar9;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  long *local_100 [2];
  long local_f0 [25];
  
  if ((accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_),
     __addr = extraout_RDX, iVar3 != 0)) {
    memcpy(local_100,&DAT_0019cdd8,0xd8);
    std::
    _Hashtable<int,std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>,std::allocator<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _Hashtable<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>const*>
              ((_Hashtable<int,std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>,std::allocator<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_,local_100,&stack0xffffffffffffffd8
               ,0,&local_101,&local_102,&local_103);
    __cxa_atexit(std::
                 unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                 ::~unordered_map,&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_);
    __addr = extraout_RDX_00;
  }
  plVar9 = *(long **)(CONCAT44(in_register_00000034,__fd) + 0x48);
  __addr_00 = this;
  (**(code **)(*plVar9 + 0x10))(plVar9,this,__addr);
  pVVar5 = this->result_;
  uVar1 = *(ushort *)(CONCAT44(in_register_00000034,__fd) + 0x40);
  __addr_len_00 =
       (socklen_t *)
       ((ulong)uVar1 % accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_._M_h._M_bucket_count &
       0xffffffff);
  p_Var2 = accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_._M_h._M_buckets[(long)__addr_len_00];
  p_Var6 = (__node_base_ptr)0x0;
  if (p_Var2 != (__node_base_ptr)0x0) {
    p_Var6 = p_Var2;
    p_Var7 = p_Var2->_M_nxt;
    if (*(uint *)&p_Var2->_M_nxt[1]._M_nxt != (uint)uVar1) {
      while (p_Var4 = p_Var7->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        __addr_00 = (IRGenerator *)(long)(int)*(uint *)&p_Var4[1]._M_nxt;
        __addr_len_00 =
             (socklen_t *)
             ((ulong)__addr_00 % accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_._M_h._M_bucket_count
             );
        p_Var6 = (__node_base_ptr)0x0;
        if ((__addr_len_00 !=
             (socklen_t *)
             ((ulong)uVar1 % accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_._M_h._M_bucket_count))
           || (p_Var6 = p_Var7, p_Var7 = p_Var4, *(uint *)&p_Var4[1]._M_nxt == (uint)uVar1))
        goto LAB_0011462d;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
  }
LAB_0011462d:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var6->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    iVar3 = accept((uint)uVar1,(sockaddr *)__addr_00,__addr_len_00);
    __cxa_guard_abort(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_);
    _Unwind_Resume(iVar3);
  }
  p_Var8 = p_Var4[2]._M_nxt;
  plVar9 = (long *)((long)&(this->super_ASTVisitor)._vptr_ASTVisitor +
                   (long)&(p_Var4[3]._M_nxt)->_M_nxt);
  if (((ulong)p_Var8 & 1) != 0) {
    p_Var8 = *(_Hash_node_base **)(*plVar9 + -1 + (long)p_Var8);
  }
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
  pVVar5 = (Value *)(*(code *)p_Var8)(plVar9,pVVar5,local_100);
  this->result_ = pVVar5;
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
    pVVar5 = extraout_RAX;
  }
  return (int)pVVar5;
}

Assistant:

void IRGenerator::accept(UnaryExpr& expr) {
  static const std::unordered_map<
      int /*Opcode*/,
      Value* (IRGenerator::*)(Value*, const std::string&)> ops =
      {{Opcode::N2S, &IRGenerator::createN2S},
       {Opcode::P2S, &IRGenerator::createP2S},
       {Opcode::C2S, &IRGenerator::createC2S},
       {Opcode::R2S, &IRGenerator::createR2S},
       {Opcode::S2N, &IRGenerator::createS2N},
       {Opcode::NNEG, &IRGenerator::createNeg},
       {Opcode::NNOT, &IRGenerator::createNot},
       {Opcode::BNOT, &IRGenerator::createBNot},
       {Opcode::SLEN, &IRGenerator::createSLen}, };

  Value* rhs = codegen(expr.subExpr());

  auto i = ops.find(expr.op());
  FLOW_ASSERT(i != ops.end(), fmt::format("Unsupported unary expression {} in IRGenerator.", mnemonic(expr.op())));
  result_ = (this->*i->second)(rhs, "");
}